

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

vector<Pathie::Path,_std::allocator<Pathie::Path>_> *
Pathie::Path::get_xdg_dirlist
          (vector<Pathie::Path,_std::allocator<Pathie::Path>_> *__return_storage_ptr__,
          string *envvarname,string *defaultlist)

{
  char *__s;
  size_t sVar1;
  long lVar2;
  vector<Pathie::Path,_std::allocator<Pathie::Path>_> *results;
  string envstr;
  string env_nstr;
  string local_f0;
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined1 local_c0 [16];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  utf8_to_filename(&local_50,envvarname);
  __s = getenv(local_50._M_dataplus._M_p);
  local_d0 = local_c0;
  local_c8 = 0;
  local_c0[0] = 0;
  if ((__s == (char *)0x0) || (*__s == '\0')) {
    std::__cxx11::string::_M_assign((string *)&local_d0);
  }
  else {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    sVar1 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,__s,__s + sVar1);
    filename_to_utf8(&local_f0,&local_90);
    std::__cxx11::string::_M_assign((string *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
  }
  (__return_storage_ptr__->super__Vector_base<Pathie::Path,_std::allocator<Pathie::Path>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Pathie::Path,_std::allocator<Pathie::Path>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Pathie::Path,_std::allocator<Pathie::Path>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while (lVar2 = std::__cxx11::string::find((char *)&local_d0,0x10f1d4,0), lVar2 != -1) {
    std::__cxx11::string::substr((ulong)&local_b0,(ulong)&local_d0);
    Path((Path *)&local_f0,&local_b0);
    std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>::push_back
              (__return_storage_ptr__,(value_type *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_d0);
  Path((Path *)&local_f0,&local_70);
  std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>::push_back
            (__return_storage_ptr__,(value_type *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Path> Path::get_xdg_dirlist(const std::string& envvarname, const std::string& defaultlist)
{
  std::string env_nstr = utf8_to_filename(envvarname); // environment is encoded the same as the filenames
  char* env_value = getenv(env_nstr.c_str());
  std::string envstr;
  if (env_value && strcmp(env_value, "") != 0)
    envstr = filename_to_utf8(env_value); // Encode entire env string to UTF-8
  else
    envstr = defaultlist;

  size_t pos = 0;
  size_t lastpos = 0;
  std::vector<Path> results;
  while ((pos = envstr.find(":")) != string::npos) {
    results.push_back(Path(envstr.substr(lastpos, pos))); // envstr is already UTF-8

    lastpos = pos + 1;
    pos++;
  }

  results.push_back(envstr.substr(lastpos));

  return results;
}